

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O2

void __thiscall
TableBaseExpression::GenerateElementCode
          (TableBaseExpression *this,ExpressionPtr *key,ExpressionPtr *value,char eolChar,
          ostream *out,int n)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  shared_ptr<ConstantExpression> labelExp;
  string name;
  shared_ptr<ArrayIndexingExpression> derefExp;
  shared_ptr<ConstantExpression> labelExp_1;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  iVar3 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_Expression)();
  if ((iVar3 == 7) ||
     (iVar3 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 _vptr_Expression)(), iVar3 == 0xb)) {
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,&key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
    ConstantExpression::AsLabelExpression
              ((ConstantExpression *)&labelExp_1,(ExpressionPtr *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if (labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      iVar3 = (**((key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 _vptr_Expression)();
      if (iVar3 == 5) {
        std::static_pointer_cast<OperatorExpression,Expression>((shared_ptr<Expression> *)&labelExp)
        ;
        iVar3 = *(int *)&((labelExp.
                           super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          )->m_text)._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (iVar3 == -0xfffff9) {
          std::static_pointer_cast<ArrayIndexingExpression,Expression>
                    ((shared_ptr<Expression> *)&derefExp);
          bVar2 = ArrayIndexingExpression::IsSimpleMemberDeref
                            (derefExp.
                             super___shared_ptr<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
          if (bVar2) {
            iVar3 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->_vptr_Expression)();
            if (iVar3 == 7) {
              ArrayIndexingExpression::ToFunctionNameString_abi_cxx11_
                        ((string *)&labelExp,
                         derefExp.
                         super___shared_ptr<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            else {
              ArrayIndexingExpression::ToString_abi_cxx11_
                        ((string *)&labelExp,
                         derefExp.
                         super___shared_ptr<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            std::__cxx11::string::operator=((string *)&name,(string *)&labelExp);
            std::__cxx11::string::~string((string *)&labelExp);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&derefExp.
                      super___shared_ptr<ArrayIndexingExpression,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
      }
    }
    else {
      ConstantExpression::GetLabel_abi_cxx11_
                ((string *)&labelExp,
                 labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
      std::__cxx11::string::operator=((string *)&name,(string *)&labelExp);
      std::__cxx11::string::~string((string *)&labelExp);
    }
    if (name._M_string_length != 0) {
      iVar3 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 _vptr_Expression)();
      if (iVar3 == 7) {
        std::static_pointer_cast<FunctionExpression,Expression>((shared_ptr<Expression> *)&labelExp)
        ;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_text);
      }
      else {
        std::static_pointer_cast<NewClassExpression,Expression>((shared_ptr<Expression> *)&labelExp)
        ;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->m_text);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      peVar1 = (value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
      std::endl<char,std::char_traits<char>>(out);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&name);
      return;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&labelExp_1.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&name);
  }
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  ConstantExpression::AsLabelExpression((ConstantExpression *)&labelExp,(ExpressionPtr *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  if (labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::operator<<(out,'[');
    peVar1 = (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
    std::operator<<(out,']');
  }
  else {
    ConstantExpression::GetLabel_abi_cxx11_
              (&name,labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
    std::operator<<(out,(string *)&name);
    std::__cxx11::string::~string((string *)&name);
  }
  std::operator<<(out," = ");
  peVar1 = (value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
  if (eolChar != '\0') {
    std::operator<<(out,eolChar);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&labelExp.super___shared_ptr<ConstantExpression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

inline void TableBaseExpression::GenerateElementCode( ExpressionPtr key, ExpressionPtr value, char eolChar, std::ostream& out, int n ) const
{
	if (value->GetType() == Exp_Function || value->GetType() == Exp_NewClassExpression)
	{
		// Member function or nested class - find its name
		std::string name;
			
		shared_ptr<ConstantExpression> labelExp = ConstantExpression::AsLabelExpression(key);
		if (labelExp)
		{
			name = labelExp->GetLabel();
		}
		else if (key->GetType() == Exp_Operator && static_pointer_cast<OperatorExpression>(key)->GetOperatorType() == OperatorExpression::OPER_ARRAYIND)
		{
			shared_ptr<ArrayIndexingExpression> derefExp = static_pointer_cast<ArrayIndexingExpression>(key);
			if (derefExp->IsSimpleMemberDeref())
			{
				if (value->GetType() == Exp_Function)
					name = derefExp->ToFunctionNameString();
				else
					name = derefExp->ToString();
			}
		}

		if (!name.empty())
		{
			if (value->GetType() == Exp_Function)
			{
				shared_ptr<FunctionExpression> func = static_pointer_cast<FunctionExpression>(value);
				func->SetName(name);
			}
			else
			{
				shared_ptr<NewClassExpression> newClass = static_pointer_cast<NewClassExpression>(value);
				newClass->SetName(name);
			}

			value->GenerateCode(out, n);
			out << std::endl;
			return;
		}
	}

	shared_ptr<ConstantExpression> labelExp = ConstantExpression::AsLabelExpression(key);
	if (labelExp)
	{
		out << labelExp->GetLabel();
	}
	else
	{
		out << '[';
		key->GenerateCode(out, n);
		out << ']';
	}

	out << " = ";
	value->GenerateCode(out, n);

	if (eolChar != 0)
		out << eolChar;
}